

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

int __thiscall
OpenMD::SelectionEvaluator::select
          (SelectionEvaluator *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  int extraout_EAX;
  undefined4 in_register_00000034;
  SelectionSet SStack_28;
  
  expression(&SStack_28,this,&this->statement,1,(int)__readfds);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::_M_move_assign
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
             CONCAT44(in_register_00000034,__nfds),&SStack_28);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&SStack_28.bitsets_);
  return extraout_EAX;
}

Assistant:

void SelectionEvaluator::select(SelectionSet& bs, int frame) {
    bs = expression(statement, 1, frame);
  }